

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningHeuristics.h
# Opt level: O0

bool InliningHeuristics::IsInlineeLeaf(FunctionJITTimeInfo *inlinee)

{
  bool bVar1;
  ProfileId PVar2;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *pJVar3;
  JITTimeProfileInfo *this;
  byte local_11;
  FunctionJITTimeInfo *inlinee_local;
  
  pJVar3 = FunctionJITTimeInfo::GetBody(inlinee);
  bVar1 = JITTimeFunctionBody::HasProfileInfo(pJVar3);
  local_11 = 0;
  if (bVar1) {
    sourceContextId = FunctionJITTimeInfo::GetSourceContextId(inlinee);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(inlinee);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01eafdf0,InlineBuiltInCallerPhase,sourceContextId,functionId);
    if (bVar1) {
      pJVar3 = FunctionJITTimeInfo::GetBody(inlinee);
      PVar2 = JITTimeFunctionBody::GetProfiledCallSiteCount(pJVar3);
      local_11 = 0;
      if (PVar2 != 0) goto LAB_0073190f;
    }
    else {
      pJVar3 = FunctionJITTimeInfo::GetBody(inlinee);
      bVar1 = JITTimeFunctionBody::HasNonBuiltInCallee(pJVar3);
      local_11 = 0;
      if (bVar1) goto LAB_0073190f;
    }
    pJVar3 = FunctionJITTimeInfo::GetBody(inlinee);
    this = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar3);
    bVar1 = JITTimeProfileInfo::HasLdFldCallSiteInfo(this);
    local_11 = bVar1 ^ 0xff;
  }
LAB_0073190f:
  return (bool)(local_11 & 1);
}

Assistant:

static bool IsInlineeLeaf(const FunctionJITTimeInfo * inlinee)
    {
        return inlinee->GetBody()->HasProfileInfo()
            && (!PHASE_OFF(Js::InlineBuiltInCallerPhase, inlinee) ? !inlinee->GetBody()->HasNonBuiltInCallee() : inlinee->GetBody()->GetProfiledCallSiteCount() == 0)
            && !inlinee->GetBody()->GetReadOnlyProfileInfo()->HasLdFldCallSiteInfo();
    }